

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsColscale(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  type_conflict5 tVar1;
  int iVar2;
  long in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  Real RVar3;
  int i;
  DataArray<int> *colscaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *mini;
  double in_stack_00000090;
  cpp_dec_float<200U,_int,_void> *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  cpp_dec_float<200U,_int,_void> *this_00;
  Real local_68;
  Real local_60;
  int local_54;
  DataArray<int> *local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  Real *local_18;
  Real *local_8;
  
  local_50 = *(DataArray<int> **)(in_RSI + 0x10);
  this_00 = in_RDI;
  local_30 = infinity();
  local_38 = 0;
  local_20 = local_30;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)in_RDI,
             (type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_54 = 0;
  while (iVar4 = local_54, iVar2 = DataArray<int>::size(local_50), iVar4 < iVar2) {
    DataArray<int>::operator[](local_50,local_54);
    RVar3 = spxLdexp((Real)CONCAT44(iVar4,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
    local_60 = spxAbs<double>(RVar3);
    tVar1 = boost::multiprecision::operator<
                      ((double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x7509f9);
    if (tVar1) {
      DataArray<int>::operator[](local_50,local_54);
      RVar3 = spxLdexp((Real)CONCAT44(iVar4,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
      local_68 = spxAbs<double>(RVar3);
      local_18 = &local_68;
      local_8 = local_18;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_00000098,in_stack_00000090);
    }
    local_54 = local_54 + 1;
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SPxScaler<R>::minAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R mini = R(infinity);

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) < mini)
         mini = spxAbs(spxLdexp(1.0, colscaleExp[i]));

   return mini;
}